

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

void __thiscall tfs::TMatrix<double>::~TMatrix(TMatrix<double> *this)

{
  if (this->m_data != (double *)0x0) {
    operator_delete__(this->m_data);
  }
  this->m_data = (double *)0x0;
  this->m_end = (double *)0x0;
  this->m_count = 0;
  this->m_length = 0;
  return;
}

Assistant:

~TMatrix( void ) {      // Destructor
            delete[] m_data;
            m_data   = 0;
            m_end    = 0;
            m_count  = 0;
            m_length = 0;
        }